

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O2

void __thiscall EmitXml::spaces(EmitXml *this,int4 num,int4 bump)

{
  bool bVar1;
  string spc;
  
  if (num < 0xb) {
    (*this->_vptr_EmitXml[0x19])(this,"          " + (10 - num),8);
    return;
  }
  spc._M_dataplus._M_p = (pointer)&spc.field_2;
  spc._M_string_length = 0;
  spc.field_2._M_local_buf[0] = '\0';
  while (bVar1 = num != 0, num = num + -1, bVar1) {
    std::__cxx11::string::push_back((char)&spc);
  }
  (*this->_vptr_EmitXml[0x19])(this,spc._M_dataplus._M_p,8);
  std::__cxx11::string::~string((string *)&spc);
  return;
}

Assistant:

void EmitXml::spaces(int4 num,int4 bump)

{
  const char *tenspaces = "          ";
  if (num <= 10)
    print(tenspaces+(10-num));
  else {
    string spc;
    for(int4 i=0;i<num;++i)
      spc += ' ';
    print(spc.c_str());
  }
}